

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O0

bool __thiscall
RSTARPlanner::Search
          (RSTARPlanner *this,vector<int,_std::allocator<int>_> *pathIds,int *PathCost,
          bool bFirstSolution,bool bOptimalSolution,double MaxNumofSecs)

{
  pointer *ppiVar1;
  double dVar2;
  int iVar3;
  pointer piVar4;
  size_type sVar5;
  clock_t cVar6;
  size_type sVar7;
  byte in_CL;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  byte in_R8B;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  bool ret;
  int CurrentPathCost;
  vector<int,_std::allocator<int>_> CurrentPathIds;
  clock_t loop_time;
  int prevexpands;
  int oldenvsize;
  CKey key;
  double in_stack_000001a8;
  RSTARPlanner *in_stack_000001b0;
  int *in_stack_00000240;
  RSTARPlanner *in_stack_00000248;
  uint in_stack_ffffffffffffff5c;
  int local_94;
  int local_74;
  RSTARPlanner *in_stack_ffffffffffffff90;
  CKey local_38;
  double local_28;
  byte local_1a;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_28 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  CKey::CKey(&local_38);
  piVar4 = (pointer)clock();
  in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piVar4;
  *(undefined4 *)
   &in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 0;
  *(undefined4 *)
   ((long)&in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start + 4) = 0;
  *(undefined4 *)
   &(in_RDX->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
       = 1000000000;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1aa012);
  *(pointer *)
   in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
  piVar4 = in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar4[2] = 0;
  piVar4[3] = 0x41cdcd65;
  if ((*(byte *)((long)in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 0x49) & 1) == 1) {
    ReInitializeSearchStateSpace(in_stack_ffffffffffffff90);
  }
  if ((local_1a & 1) == 0) {
    if ((local_19 & 1) != 0) {
      local_28 = 1000000000.0;
    }
  }
  else {
    piVar4 = in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    piVar4[0] = 0;
    piVar4[1] = 0x3ff00000;
    local_28 = 1000000000.0;
  }
  sVar5 = std::vector<int_*,_std::allocator<int_*>_>::size
                    ((vector<int_*,_std::allocator<int_*>_> *)
                     ((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish + 2));
  do {
    dVar2 = *(double *)
             (in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish + 2);
    ppiVar1 = &in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    in_stack_ffffffffffffff5c = in_stack_ffffffffffffff5c & 0xffffff;
    if ((double)*ppiVar1 <= dVar2 && dVar2 != (double)*ppiVar1) {
      cVar6 = clock();
      in_stack_ffffffffffffff5c =
           CONCAT13((double)(cVar6 - (long)in_RDI[3].super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage) <
                    local_28 * 1000000.0,(int3)in_stack_ffffffffffffff5c);
    }
    if ((char)(in_stack_ffffffffffffff5c >> 0x18) == '\0') break;
    clock();
    if ((ABS(*(double *)
              (in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + 2) -
             *(double *)
              in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) < 1e-07) && ((local_19 & 1) == 0)) {
      *(double *)
       in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = *(double *)
                    in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
                   (double)in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
      if (*(double *)
           in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish <
          (double)in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
        *(pointer *)
         in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
      }
      *(undefined1 *)
       (in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish + 0x12) = 1;
      *(undefined1 *)
       ((long)in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish + 0x4a) = 1;
      *(undefined1 *)
       ((long)in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish + 0x49) = 1;
    }
    ReInitializeSearchStateSpace(in_stack_ffffffffffffff90);
    if ((*(byte *)((long)in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 0x4a) & 1) != 0) {
      piVar4 = in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      *(short *)(piVar4 + 6) = (short)piVar4[6] + 1;
      *(undefined1 *)
       ((long)in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish + 0x4a) = 0;
    }
    if ((*(byte *)(in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 0x12) & 1) != 0) {
      Reevaluatefvals(in_stack_ffffffffffffff90);
    }
    iVar3 = ImprovePath(in_stack_000001b0,in_stack_000001a8);
    if (iVar3 == 1) {
      *(undefined8 *)
       (in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish + 2) =
           *(undefined8 *)
            in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish;
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1aa274);
    local_74 = *(int *)(*(long *)(*(long *)(in_RDI[2].super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_finish + 8) + 0x38) +
                       0x20);
    if ((local_74 == 1000000000) ||
       (sVar7 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           (*(long *)(*(long *)(*(long *)(*(long *)(in_RDI[2].
                                                                                                                                        
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish + 8) +
                                                  0x38) + 0x28) + 0x50) + 8)), sVar7 == 0)) {
      local_74 = 1000000000;
    }
    else {
      GetSearchPath(in_stack_00000248,in_stack_00000240);
      std::vector<int,_std::allocator<int>_>::operator=
                (in_RDI,(vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffff5c,iVar3));
      std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
    }
    if (local_74 <
        *(int *)&(in_RDX->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start) {
      *(int *)&(in_RDX->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start = local_74;
      std::vector<int,_std::allocator<int>_>::operator=(in_RSI,in_RDX);
    }
    if ((local_19 & 1) == 0) {
      if (*(int *)(*(long *)(*(long *)(in_RDI[2].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish + 8) + 0x38) + 0x20
                  ) == 1000000000) {
        local_94 = 3;
      }
      else {
        local_94 = 0;
      }
    }
    else {
      local_94 = 3;
    }
    std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  } while (local_94 == 0);
  sVar7 = std::vector<int_*,_std::allocator<int_*>_>::size
                    ((vector<int_*,_std::allocator<int_*>_> *)
                     ((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish + 2));
  *(int *)&in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish =
       *(int *)&in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + ((int)(sVar5 << 2) - (int)(sVar7 << 2));
  iVar3 = *(int *)&(in_RDX->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  CKey::~CKey(&local_38);
  return iVar3 != 1000000000;
}

Assistant:

bool RSTARPlanner::Search(vector<int>& pathIds, int & PathCost, bool bFirstSolution, bool bOptimalSolution,
                          double MaxNumofSecs)
{
    CKey key;
    TimeStarted = clock();
    highlevel_searchexpands = 0;
    lowlevel_searchexpands = 0;

    //reset the return values
    PathCost = INFINITECOST;
    pathIds.clear();

    //bFirstSolution = false; //TODO-remove this but then fix crashing because later
    //searches within cycle re-initialize g-vals and test path found fails if last search ran out of time
    //so we need to save solutions between iterations
    //also, we need to call change callnumber before each search

#if DEBUG
    SBPL_FPRINTF(fDeb, "new search call (call number=%d)\n", pSearchStateSpace->callnumber);
#endif

    //set epsilons
    pSearchStateSpace->eps = this->finitial_eps;
    pSearchStateSpace->eps_satisfied = INFINITECOST;

    if (pSearchStateSpace->bReinitializeSearchStateSpace == true) {
        //re-initialize state space
        ReInitializeSearchStateSpace();
    }

    if (bOptimalSolution) {
        pSearchStateSpace->eps = 1;
        MaxNumofSecs = INFINITECOST;
    }
    else if (bFirstSolution) {
        MaxNumofSecs = INFINITECOST;
    }

    //get the size of environment that is already allocated
    int oldenvsize = environment_->StateID2IndexMapping.size() * sizeof(int);

    //the main loop of R*
    int prevexpands = 0;
    clock_t loop_time;
    //TODO - change FINAL_EPS and DECREASE_EPS onto a parameter
    while (pSearchStateSpace->eps_satisfied > final_epsilon &&
           (clock() - TimeStarted) < MaxNumofSecs * (double)CLOCKS_PER_SEC)
    {
        loop_time = clock();

        //decrease eps for all subsequent iterations
        if (fabs(pSearchStateSpace->eps_satisfied - pSearchStateSpace->eps) < ERR_EPS && !bFirstSolution) {
            pSearchStateSpace->eps = pSearchStateSpace->eps - dec_eps;
            if (pSearchStateSpace->eps < final_epsilon) pSearchStateSpace->eps = final_epsilon;

            //the priorities need to be updated
            pSearchStateSpace->bReevaluatefvals = true;

            //it will be a new search. Since R* is non-incremental, it will have to be a new call
            pSearchStateSpace->bNewSearchIteration = true;
            pSearchStateSpace->bReinitializeSearchStateSpace = true;
        }

        //if(pSearchStateSpace->bReinitializeSearchStateSpace == true){
        //re-initialize state space
        ReInitializeSearchStateSpace(); //TODO - we have to do it currently since g-vals from old searches are invalid
        //}

        if (pSearchStateSpace->bNewSearchIteration) {
            pSearchStateSpace->searchiteration++;
            pSearchStateSpace->bNewSearchIteration = false;
        }

        //re-compute f-values if necessary and reorder the heap
        if (pSearchStateSpace->bReevaluatefvals) Reevaluatefvals();

        //improve or compute path
        if (ImprovePath(MaxNumofSecs) == 1) {
            pSearchStateSpace->eps_satisfied = pSearchStateSpace->eps; //note: eps is satisfied probabilistically
        }

        //print the solution cost and eps bound
        SBPL_PRINTF("eps=%f highlevel expands=%d g(searchgoal)=%d time=%.3f\n", pSearchStateSpace->eps_satisfied,
                    highlevel_searchexpands - prevexpands,
                    ((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g,
                    double(clock() - loop_time) / CLOCKS_PER_SEC);

#if DEBUG
        SBPL_FPRINTF(fDeb, "eps=%f highlevel expands=%d g(searchgoal)=%d time=%.3f\n",
                     pSearchStateSpace->eps_satisfied, highlevel_searchexpands - prevexpands,
                     ((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g,
                     double(clock()-loop_time)/CLOCKS_PER_SEC);
        PrintSearchState((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData, fDeb);
#endif
        prevexpands = highlevel_searchexpands;

        //keep track of the best solution so far
        vector<int> CurrentPathIds;
        int CurrentPathCost = ((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g;
        if (CurrentPathCost == INFINITECOST ||
            ((RSTARACTIONDATA*)((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->bestpredaction->PlannerSpecificData)->pathIDs.size() == 0)
        {
            //the path to the goal is not found, it is just goal has been
            //generated but the last edge to it wasn't computed yet
            CurrentPathCost = INFINITECOST;
        }
        else {
            //get the found path
            CurrentPathIds = GetSearchPath(CurrentPathCost);
        }
        //keep track of the best solution
        if (CurrentPathCost < PathCost) {
            PathCost = CurrentPathCost;
            pathIds = CurrentPathIds;
        }

        //if just the first solution then we are done
        if (bFirstSolution) break;

        //no solution exists
        if (((RSTARState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g == INFINITECOST) break;
    }

#if DEBUG
    SBPL_FFLUSH(fDeb);
#endif

    MaxMemoryCounter += (oldenvsize - environment_->StateID2IndexMapping.size() * sizeof(int));
    SBPL_PRINTF("MaxMemoryCounter = %d\n", MaxMemoryCounter);

    bool ret = false;
    if (PathCost == INFINITECOST) {
        SBPL_PRINTF("could not find a solution\n");
        ret = false;
    }
    else {
        SBPL_PRINTF("solution is found\n");
        ret = true;
    }

    SBPL_PRINTF("total highlevel expands this call = %d, planning time = %.3f secs, solution cost=%d\n",
                highlevel_searchexpands, (clock() - TimeStarted) / ((double)CLOCKS_PER_SEC), PathCost);

    //SBPL_FPRINTF(fStat, "%d %d\n", highlevel_searchexpands, MinPathCost);

    return ret;
}